

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_matcher.cxx
# Opt level: O2

WithinAbsMatcher *
IntegratorXX::Matchers::WithinAbs
          (WithinAbsMatcher *__return_storage_ptr__,string *msg,double target,double margin)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)msg);
  WithinAbsMatcher::WithinAbsMatcher(__return_storage_ptr__,&local_30,target,margin);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

WithinAbsMatcher WithinAbs(std::string msg, double target, double margin) {
    return WithinAbsMatcher(msg, target, margin);
}